

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommonstyle_p.h
# Opt level: O2

bool __thiscall
QCommonStylePrivate::isViewItemCached(QCommonStylePrivate *this,QStyleOptionViewItem *option)

{
  QStyleOptionViewItem *pQVar1;
  bool bVar2;
  char cVar3;
  char cVar4;
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  
  pQVar1 = this->cachedOption;
  if ((((((pQVar1 != (QStyleOptionViewItem *)0x0) && (option->widget == pQVar1->widget)) &&
        (bVar2 = ::comparesEqual(&option->index,&pQVar1->index), bVar2)) &&
       ((((option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
          super_QFlagsStorage<QStyle::StateFlag>.i ==
          (this->cachedOption->super_QStyleOption).state.
          super_QFlagsStorageHelper<QStyle::StateFlag,_4>.super_QFlagsStorage<QStyle::StateFlag>.i
         && (bVar2 = ::comparesEqual(&(option->super_QStyleOption).rect,
                                     &(this->cachedOption->super_QStyleOption).rect), bVar2)) &&
        ((bVar2 = ::comparesEqual(&option->text,&this->cachedOption->text), bVar2 &&
         ((pQVar1 = this->cachedOption,
          (option->super_QStyleOption).direction == (pQVar1->super_QStyleOption).direction &&
          ((option->displayAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
           super_QFlagsStorage<Qt::AlignmentFlag>.i ==
           (pQVar1->displayAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
           super_QFlagsStorage<Qt::AlignmentFlag>.i)))))))) &&
      ((option->decorationAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
       super_QFlagsStorage<Qt::AlignmentFlag>.i ==
       (pQVar1->decorationAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
       super_QFlagsStorage<Qt::AlignmentFlag>.i)) &&
     (((option->decorationPosition == pQVar1->decorationPosition &&
       (iVar6 = -(uint)((pQVar1->decorationSize).wd.m_i == (option->decorationSize).wd.m_i),
       iVar7 = -(uint)((pQVar1->decorationSize).ht.m_i == (option->decorationSize).ht.m_i),
       auVar5._4_4_ = iVar6, auVar5._0_4_ = iVar6, auVar5._8_4_ = iVar7, auVar5._12_4_ = iVar7,
       iVar6 = movmskpd(option->decorationPosition,auVar5), iVar6 == 3)) &&
      ((option->features).super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
       super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i ==
       (pQVar1->features).super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
       super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i)))) {
    cVar3 = QIcon::isNull();
    cVar4 = QIcon::isNull();
    if (((cVar3 == cVar4) &&
        (cVar3 = QFont::operator==(&option->font,&this->cachedOption->font), cVar3 != '\0')) &&
       (option->viewItemPosition == this->cachedOption->viewItemPosition)) {
      return option->showDecorationSelected == this->cachedOption->showDecorationSelected;
    }
  }
  return false;
}

Assistant:

bool isViewItemCached(const QStyleOptionViewItem &option) const {
        return cachedOption && (option.widget == cachedOption->widget
               && option.index == cachedOption->index
               && option.state == cachedOption->state
               && option.rect == cachedOption->rect
               && option.text == cachedOption->text
               && option.direction == cachedOption->direction
               && option.displayAlignment == cachedOption->displayAlignment
               && option.decorationAlignment == cachedOption->decorationAlignment
               && option.decorationPosition == cachedOption->decorationPosition
               && option.decorationSize == cachedOption->decorationSize
               && option.features == cachedOption->features
               && option.icon.isNull() == cachedOption->icon.isNull()
               && option.font == cachedOption->font
               && option.viewItemPosition == cachedOption->viewItemPosition
               && option.showDecorationSelected == cachedOption->showDecorationSelected);
    }